

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

OpCode __thiscall
ByteCodeGenerator::GetInitFldOp
          (ByteCodeGenerator *this,Scope *scope,RegSlot scopeLocation,FuncInfo *funcInfo,
          bool letDecl)

{
  OpCode OVar1;
  OpCode OVar2;
  
  if ((scopeLocation == 0xffffffff) || (funcInfo->frameObjRegister != scopeLocation)) {
    if (scope->innerScopeIndex != 0xffffffff) {
      return letDecl | InitInnerFld;
    }
    OVar2 = InitLetFld;
    OVar1 = InitFld;
  }
  else {
    OVar2 = InitLocalLetFld;
    OVar1 = InitLocalFld;
  }
  if (letDecl) {
    OVar1 = OVar2;
  }
  return OVar1;
}

Assistant:

Js::OpCode
ByteCodeGenerator::GetInitFldOp(Scope *scope, Js::RegSlot scopeLocation, FuncInfo *funcInfo, bool letDecl)
{
    Js::OpCode op;

    if (scopeLocation != Js::Constants::NoRegister &&
        scopeLocation == funcInfo->frameObjRegister)
    {
        op = letDecl ? Js::OpCode::InitLocalLetFld : Js::OpCode::InitLocalFld;
    }
    else if (scope->HasInnerScopeIndex())
    {
        op = letDecl ? Js::OpCode::InitInnerLetFld : Js::OpCode::InitInnerFld;
    }
    else
    {
        op = letDecl ? Js::OpCode::InitLetFld : Js::OpCode::InitFld;
    }

    return op;
}